

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_flip_closed(roaring64_bitmap_t *r1,uint64_t min,uint64_t max)

{
  art_ref_t ref;
  long lVar1;
  roaring64_bitmap_t *prVar2;
  _Bool _Var3;
  uint8_t type;
  int iVar4;
  roaring64_bitmap_t *prVar5;
  ulong uVar6;
  container_t *pcVar7;
  leaf_t lVar8;
  art_val_t *paVar9;
  ulong uVar10;
  array_container_t *paVar11;
  uint64_t *puVar12;
  uint uVar13;
  array_container_t *paVar14;
  uint uVar15;
  uint8_t uVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 *puVar19;
  uint32_t min_00;
  bool bVar20;
  uint8_t current_high48_key [6];
  uint8_t min_high48_key [6];
  uint8_t max_high48_key [6];
  art_iterator_t iterator;
  array_container_t *local_100;
  uint local_f8;
  ushort local_f4;
  uint local_f0;
  ushort local_ec;
  roaring64_bitmap_t *local_e8;
  ulong local_e0;
  uint local_d8;
  ushort local_d4;
  ulong local_d0;
  ulong local_c8;
  art_iterator_t local_c0;
  
  if (max < min) {
    prVar5 = roaring64_bitmap_copy(r1);
    return prVar5;
  }
  local_f0 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
             (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
  local_ec = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
  local_d8 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
             (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
  local_d4 = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
  prVar5 = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
  (prVar5->art).root = 0;
  (prVar5->art).first_free[0] = 0;
  (prVar5->art).first_free[1] = 0;
  (prVar5->art).first_free[2] = 0;
  (prVar5->art).first_free[3] = 0;
  (prVar5->art).first_free[4] = 0;
  (prVar5->art).first_free[5] = 0;
  (prVar5->art).capacities[0] = 0;
  (prVar5->art).capacities[1] = 0;
  (prVar5->art).capacities[2] = 0;
  (prVar5->art).capacities[3] = 0;
  (prVar5->art).capacities[4] = 0;
  (prVar5->art).capacities[5] = 0;
  (prVar5->art).nodes[1] = (art_node_t *)0x0;
  (prVar5->art).nodes[2] = (art_node_t *)0x0;
  (prVar5->art).nodes[3] = (art_node_t *)0x0;
  (prVar5->art).nodes[4] = (art_node_t *)0x0;
  *(undefined8 *)((long)(prVar5->art).nodes + 0x21) = 0;
  *(undefined8 *)((long)(prVar5->art).nodes + 0x29) = 0;
  prVar5->first_free = 0;
  prVar5->capacity = 0;
  prVar5->containers = (container_t **)0x0;
  memset(&local_c0,0,0x90);
  ref = (r1->art).root;
  local_c0.art = &r1->art;
  if (ref != 0) {
    art_node_init_iterator(ref,&local_c0,true);
  }
  local_e0 = min >> 0x10;
  local_d0 = max >> 0x10;
  if (local_c0.value != (ulong *)0x0) {
    do {
      uVar13 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
               (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
      uVar15 = local_f0 >> 0x18 | (local_f0 & 0xff0000) >> 8 | (local_f0 & 0xff00) << 8 |
               local_f0 << 0x18;
      if (uVar13 == uVar15) {
        uVar13 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
        uVar15 = (uint)(ushort)(local_ec << 8 | local_ec >> 8);
        uVar17 = 0;
        if (uVar13 != uVar15) goto LAB_0012a5ce;
      }
      else {
LAB_0012a5ce:
        uVar17 = -(uint)(uVar13 < uVar15) | 1;
      }
      if (-1 < (int)uVar17) break;
      uVar6 = *local_c0.value;
      puVar19 = (undefined8 *)r1->containers[uVar6 >> 8];
      if ((char)uVar6 == '\x04') {
        uVar6 = (ulong)*(byte *)(puVar19 + 1);
        puVar19 = (undefined8 *)*puVar19;
      }
      pcVar7 = container_clone(puVar19,(uint8_t)uVar6);
      lVar8 = add_container(prVar5,pcVar7,(uint8_t)uVar6);
      art_insert((art_t *)prVar5,local_c0.key,lVar8);
      art_iterator_move(&local_c0,true);
    } while (local_c0.value != (ulong *)0x0);
  }
  local_e8 = r1;
  if (local_e0 <= local_d0) {
    local_c8 = (ulong)(((uint)max & 0xffff) + 1);
    uVar6 = local_e0;
    do {
      local_f8 = ((uint)(uVar6 >> 0x20) & 0xff00) >> 8 | (uint)(uVar6 >> 0x18) & 0xff00 |
                 (uint)(uVar6 >> 8) & 0xff0000 | (uint)(((uVar6 & 0xff0000) << 0x18) >> 0x10);
      local_f4 = (ushort)(uVar6 >> 8) & 0xff | (ushort)((uVar6 << 0x38) >> 0x30);
      min_00 = 0;
      if (uVar6 == local_e0) {
        min_00 = (uint)min & 0xffff;
      }
      uVar13 = 0x10000;
      if (uVar6 == local_d0) {
        uVar13 = (uint)local_c8;
      }
      paVar9 = art_find(&local_e8->art,(art_key_chunk_t *)&local_f8);
      if (paVar9 == (art_val_t *)0x0) {
        if ((uVar13 - min_00) + 1 < 3) {
          paVar11 = array_container_create_range(min_00,uVar13);
          type = '\x02';
        }
        else {
          paVar11 = (array_container_t *)(*global_memory_hook.malloc)(0x10);
          if (paVar11 == (array_container_t *)0x0) {
LAB_0012a83b:
            paVar11 = (array_container_t *)0x0;
          }
          else {
            puVar12 = (uint64_t *)(*global_memory_hook.malloc)(4);
            paVar11->array = (uint16_t *)puVar12;
            if (puVar12 == (uint64_t *)0x0) {
              (*global_memory_hook.free)(paVar11);
              goto LAB_0012a83b;
            }
            paVar11->cardinality = 0;
            paVar11->capacity = 1;
          }
          type = '\x03';
          if (paVar11 != (array_container_t *)0x0) {
            *(uint *)((long)paVar11->array + (long)paVar11->cardinality * 4) =
                 (uVar13 + ~min_00) * 0x10000 | min_00;
            paVar11->cardinality = paVar11->cardinality + 1;
          }
        }
      }
      else {
        uVar10 = *paVar9;
        if (uVar13 < 0x10000 || min_00 != 0) {
          paVar11 = (array_container_t *)local_e8->containers[uVar10 >> 8];
          if ((char)uVar10 == '\x04') {
            uVar10 = (ulong)*(byte *)&paVar11->array;
            paVar11 = *(array_container_t **)paVar11;
          }
          local_100 = (array_container_t *)0x0;
          if ((char)uVar10 == '\x03') {
            iVar4 = run_container_negation_range
                              ((run_container_t *)paVar11,min_00,uVar13,&local_100);
            type = (uint8_t)iVar4;
            paVar11 = local_100;
          }
          else {
            if (((uint)uVar10 & 0xff) == 2) {
              _Var3 = array_container_negation_range(paVar11,min_00,uVar13,&local_100);
            }
            else {
              _Var3 = bitset_container_negation_range
                                ((bitset_container_t *)paVar11,min_00,uVar13,&local_100);
            }
            type = '\x02' - _Var3;
            paVar11 = local_100;
          }
        }
        else {
          paVar11 = (array_container_t *)local_e8->containers[uVar10 >> 8];
          if ((char)uVar10 == '\x04') {
            uVar10 = (ulong)*(byte *)&paVar11->array;
            paVar11 = *(array_container_t **)paVar11;
          }
          local_100 = (array_container_t *)0x0;
          if ((char)uVar10 == '\x03') {
            iVar4 = run_container_negation_range((run_container_t *)paVar11,0,0x10000,&local_100);
            type = (uint8_t)iVar4;
            paVar11 = local_100;
          }
          else if (((uint)uVar10 & 0xff) == 2) {
            local_100 = (array_container_t *)bitset_container_create();
            array_container_negation(paVar11,(bitset_container_t *)local_100);
            type = '\x01';
            paVar11 = local_100;
          }
          else {
            _Var3 = bitset_container_negation_range
                              ((bitset_container_t *)paVar11,0,0x10000,&local_100);
            type = '\x02' - _Var3;
            paVar11 = local_100;
          }
        }
      }
      paVar14 = paVar11;
      uVar16 = type;
      if (type == '\x04') {
        uVar16 = *(uint8_t *)&paVar11->array;
        paVar14 = *(array_container_t **)paVar11;
      }
      iVar4 = paVar14->cardinality;
      if ((uVar16 == '\x03') || (uVar16 == '\x02')) {
        bVar20 = 0 < iVar4;
      }
      else {
        if (iVar4 == -1) {
          if (*(uint64_t *)paVar14->array == 0) {
            uVar10 = 0xffffffffffffffff;
            do {
              if (uVar10 == 0x3fe) {
                uVar18 = 0x3ff;
                break;
              }
              uVar18 = uVar10 + 1;
              lVar1 = uVar10 + 2;
              uVar10 = uVar18;
            } while (*(uint64_t *)((long)paVar14->array + lVar1 * 8) == 0);
            bVar20 = 0x3fe < uVar18;
          }
          else {
            bVar20 = false;
          }
        }
        else {
          bVar20 = iVar4 == 0;
        }
        bVar20 = (bool)(bVar20 ^ 1);
      }
      if (bVar20) {
        lVar8 = add_container(prVar5,paVar11,type);
        art_insert((art_t *)prVar5,(art_key_chunk_t *)&local_f8,lVar8);
      }
      else {
        container_free(paVar11,type);
      }
      bVar20 = uVar6 != local_d0;
      uVar6 = uVar6 + 1;
    } while (bVar20);
  }
  prVar2 = local_e8;
  art_upper_bound(&local_c0,&local_e8->art,(art_key_chunk_t *)&local_d8);
  if (local_c0.value != (ulong *)0x0) {
    do {
      uVar6 = *local_c0.value;
      puVar19 = (undefined8 *)prVar2->containers[uVar6 >> 8];
      if ((char)uVar6 == '\x04') {
        uVar6 = (ulong)*(byte *)(puVar19 + 1);
        puVar19 = (undefined8 *)*puVar19;
      }
      pcVar7 = container_clone(puVar19,(uint8_t)uVar6);
      lVar8 = add_container(prVar5,pcVar7,(uint8_t)uVar6);
      art_insert((art_t *)prVar5,local_c0.key,lVar8);
      art_iterator_move(&local_c0,true);
    } while (local_c0.value != (ulong *)0x0);
  }
  return prVar5;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_flip_closed(const roaring64_bitmap_t *r1,
                                                 uint64_t min, uint64_t max) {
    if (min > max) {
        return roaring64_bitmap_copy(r1);
    }
    uint8_t min_high48_key[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48_key);
    uint8_t max_high48_key[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48_key);
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    roaring64_bitmap_t *r2 = roaring64_bitmap_create();
    art_iterator_t it = art_init_iterator((art_t *)&r1->art, /*first=*/true);

    // Copy the containers before min unchanged.
    while (it.value != NULL && compare_high48(it.key, min_high48_key) < 0) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf(r1, r2, current_high48_key, min_container,
                            max_container);
    }

    // Copy the containers after max unchanged.
    it = art_upper_bound((art_t *)&r1->art, max_high48_key);
    while (it.value != NULL) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    return r2;
}